

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

TranslationBlock * tb_find(CPUState *cpu,TranslationBlock *last_tb,int tb_exit,uint32_t cf_mask)

{
  uc_struct_conflict7 *puVar1;
  target_ulong tVar2;
  TranslationBlock *pTVar3;
  uint uVar4;
  bool bVar5;
  long local_70;
  hook *hook;
  list_item *cur;
  uc_struct *uc;
  uc_tb prev_tb;
  uc_tb cur_tb;
  target_ulong_conflict local_30;
  uint32_t flags;
  target_ulong pc;
  TranslationBlock *tb;
  uint32_t cf_mask_local;
  int tb_exit_local;
  TranslationBlock *last_tb_local;
  CPUState *cpu_local;
  
  puVar1 = cpu->uc;
  tb._0_4_ = cf_mask;
  tb._4_4_ = tb_exit;
  _cf_mask_local = last_tb;
  last_tb_local = (TranslationBlock *)cpu;
  pc = (target_ulong)
       tb_lookup__cpu_state
                 (cpu,(target_ulong *)&local_30,(target_ulong *)&flags,(uint32_t *)&cur_tb.field_0xc
                  ,cf_mask);
  if ((TranslationBlock *)pc == (TranslationBlock *)0x0) {
    mmap_lock();
    pc = (target_ulong)
         tb_gen_code_tricore((CPUState *)last_tb_local,local_30,flags,cur_tb._12_4_,(uint32_t)tb);
    mmap_unlock();
    pTVar3 = last_tb_local;
    tVar2 = pc;
    uVar4 = tb_jmp_cache_hash_func
                      ((uc_struct_conflict15 *)last_tb_local[0xcf].page_addr[0],(ulong)local_30);
    pTVar3[1].jmp_dest[(ulong)uVar4 + 2] = tVar2;
    if (puVar1->last_tb != (TranslationBlock *)0x0) {
      prev_tb._8_8_ = ZEXT48(*(uint *)pc);
      cur_tb.pc._0_2_ = *(undefined2 *)(pc + 0xe);
      cur_tb.pc._2_2_ = *(undefined2 *)(pc + 0xc);
      uc = (uc_struct *)(ulong)(uint)puVar1->last_tb->pc;
      prev_tb.pc._0_2_ = *(undefined2 *)((long)&puVar1->last_tb->cs_base + 6);
      prev_tb.pc._2_2_ = *(undefined2 *)((long)&puVar1->last_tb->cs_base + 4);
      hook = (hook *)puVar1->hook[0xf].head;
      while( true ) {
        bVar5 = false;
        if (hook != (hook *)0x0) {
          local_70._0_4_ = hook->refs;
          local_70._4_4_ = hook->op;
          bVar5 = local_70 != 0;
        }
        if (!bVar5) break;
        if ((((*(byte *)(local_70 + 0x14) & 1) == 0) &&
            (((*(ulong *)(local_70 + 0x18) <= (ulong)*(uint *)pc &&
              ((ulong)*(uint *)pc <= *(ulong *)(local_70 + 0x20))) ||
             (*(ulong *)(local_70 + 0x20) < *(ulong *)(local_70 + 0x18))))) &&
           ((*(byte *)(local_70 + 0x14) & 1) == 0)) {
          (**(code **)(local_70 + 0x28))
                    (puVar1,&prev_tb.icount,&uc,*(undefined8 *)(local_70 + 0x30));
        }
        hook = *(hook **)hook;
      }
    }
  }
  if (*(long *)(pc + 0x48) != -1) {
    _cf_mask_local = (TranslationBlock *)0x0;
  }
  if (_cf_mask_local != (TranslationBlock *)0x0) {
    tb_add_jump(_cf_mask_local,tb._4_4_,(TranslationBlock *)pc);
  }
  return (TranslationBlock *)pc;
}

Assistant:

static inline TranslationBlock *tb_find(CPUState *cpu,
                                        TranslationBlock *last_tb,
                                        int tb_exit, uint32_t cf_mask)
{
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    uc_tb cur_tb, prev_tb;
    uc_engine *uc = cpu->uc;
    struct list_item *cur;
    struct hook *hook;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, cf_mask);
    if (tb == NULL) {
        mmap_lock();
        tb = tb_gen_code(cpu, pc, cs_base, flags, cf_mask);
        mmap_unlock();
        /* We add the TB in the virtual pc hash table for the fast lookup */
        cpu->tb_jmp_cache[tb_jmp_cache_hash_func(cpu->uc, pc)] = tb;

        if (uc->last_tb) {
            UC_TB_COPY(&cur_tb, tb);
            UC_TB_COPY(&prev_tb, uc->last_tb);
            for (cur = uc->hook[UC_HOOK_EDGE_GENERATED_IDX].head;
                cur != NULL && (hook = (struct hook *)cur->data); cur = cur->next) {
                if (hook->to_delete) {
                    continue;
                }

                if (HOOK_BOUND_CHECK(hook, (uint64_t)tb->pc)) {
                    ((uc_hook_edge_gen_t)hook->callback)(uc, &cur_tb, &prev_tb, hook->user_data);
                }
            }
        }
    }
    /* We don't take care of direct jumps when address mapping changes in
     * system emulation. So it's not safe to make a direct jump to a TB
     * spanning two pages because the mapping for the second page can change.
     */
    if (tb->page_addr[1] != -1) {
        last_tb = NULL;
    }
    /* See if we can patch the calling TB. */
    if (last_tb) {
        tb_add_jump(last_tb, tb_exit, tb);
    }

    return tb;
}